

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode ExpandedNodeId_encodeBinary(UA_ExpandedNodeId *src,UA_DataType *_)

{
  UA_StatusCode UVar1;
  uint local_20;
  byte local_19;
  UA_StatusCode retval;
  UA_Byte encoding;
  UA_DataType *__local;
  UA_ExpandedNodeId *src_local;
  
  local_19 = 0;
  if ((UA_Byte *)0x1 < (src->namespaceUri).data) {
    local_19 = 0x80;
  }
  if (src->serverIndex != 0) {
    local_19 = local_19 | 0x40;
  }
  local_20 = NodeId_encodeBinaryWithEncodingMask(&src->nodeId,local_19);
  if ((UA_Byte *)0x1 < (src->namespaceUri).data) {
    UVar1 = String_encodeBinary(&src->namespaceUri,(UA_DataType *)0x0);
    local_20 = UVar1 | local_20;
  }
  if (src->serverIndex != 0) {
    UVar1 = UInt32_encodeBinary(&src->serverIndex,(UA_DataType *)0x0);
    local_20 = UVar1 | local_20;
  }
  return local_20;
}

Assistant:

static UA_StatusCode
ExpandedNodeId_encodeBinary(UA_ExpandedNodeId const *src, const UA_DataType *_) {
    /* Set up the encoding mask */
    UA_Byte encoding = 0;
    if((void*)src->namespaceUri.data > UA_EMPTY_ARRAY_SENTINEL)
        encoding |= UA_EXPANDEDNODEID_NAMESPACEURI_FLAG;
    if(src->serverIndex > 0)
        encoding |= UA_EXPANDEDNODEID_SERVERINDEX_FLAG;

    /* Encode the content */
    UA_StatusCode retval = NodeId_encodeBinaryWithEncodingMask(&src->nodeId, encoding);
    if((void*)src->namespaceUri.data > UA_EMPTY_ARRAY_SENTINEL)
        retval |= String_encodeBinary(&src->namespaceUri, NULL);
    if(src->serverIndex > 0)
        retval |= UInt32_encodeBinary(&src->serverIndex, NULL);
    return retval;
}